

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tree_schema.c
# Opt level: O0

lys_node *
lys_node_dup_recursion
          (lys_module *module,lys_node *parent,lys_node *node,unres_schema *unres,int shallow,
          int finalize)

{
  LYS_NODE LVar1;
  lys_node *mod;
  int iVar2;
  LY_ERR *pLVar3;
  char *pcVar4;
  lys_iffeature *plVar5;
  uint8_t *puVar6;
  lys_feature **pplVar7;
  lys_node *plVar8;
  lys_module *plVar9;
  lys_type *plVar10;
  lys_type *old;
  lys_tpdf **old_00;
  lys_node_leaf **pplVar11;
  lys_unique *plVar12;
  char **ppcVar13;
  lys_restr *plVar14;
  lys_when *plVar15;
  bool bVar16;
  lys_node_case *cs_orig;
  lys_node_case *cs;
  lys_node_notif *ntf;
  lys_node_inout *io;
  lys_node_rpc_action *rpc;
  lys_node_uses *uses_orig;
  lys_node_uses *uses;
  lys_node_anydata *any_orig;
  lys_node_anydata *any;
  lys_node_list *list_orig;
  lys_node_list *list;
  lys_node_leaflist *llist_orig;
  lys_node_leaflist *llist;
  lys_node_leaf *leaf_orig;
  lys_node_leaf *leaf;
  lys_node_choice *choice_orig;
  lys_node_choice *choice;
  lys_node_container *cont_orig;
  lys_node_container *cont;
  undefined8 *puStack_80;
  uint16_t flags;
  unres_list_uniq *unique_info;
  uint size2;
  uint size1;
  uint size;
  int rc;
  int j;
  int i;
  ly_ctx *ctx;
  lys_module *tmp_mod;
  lys_node *p;
  lys_node *iter;
  lys_node *retval;
  int finalize_local;
  int shallow_local;
  unres_schema *unres_local;
  lys_node *node_local;
  lys_node *parent_local;
  lys_module *module_local;
  
  iter = (lys_node *)0x0;
  _j = module->ctx;
  cont_orig = (lys_node_container *)0x0;
  choice_orig = (lys_node_choice *)0x0;
  leaf_orig = (lys_node_leaf *)0x0;
  llist_orig = (lys_node_leaflist *)0x0;
  list_orig = (lys_node_list *)0x0;
  any_orig = (lys_node_anydata *)0x0;
  uses_orig = (lys_node_uses *)0x0;
  cs_orig = (lys_node_case *)0x0;
  LVar1 = node->nodetype;
  any = (lys_node_anydata *)node;
  list = (lys_node_list *)node;
  llist = (lys_node_leaflist *)node;
  leaf = (lys_node_leaf *)node;
  choice = (lys_node_choice *)node;
  retval._0_4_ = finalize;
  retval._4_4_ = shallow;
  _finalize_local = unres;
  unres_local = (unres_schema *)node;
  node_local = parent;
  parent_local = (lys_node *)module;
  if (LVar1 == LYS_CONTAINER) {
    cont_orig = (lys_node_container *)calloc(1,0x88);
    iter = (lys_node *)cont_orig;
  }
  else if (LVar1 == LYS_CHOICE) {
    choice_orig = (lys_node_choice *)calloc(1,0x78);
    iter = (lys_node *)choice_orig;
  }
  else if (LVar1 == LYS_LEAF) {
    leaf_orig = (lys_node_leaf *)calloc(1,200);
    iter = (lys_node *)leaf_orig;
  }
  else if (LVar1 == LYS_LEAFLIST) {
    llist_orig = (lys_node_leaflist *)calloc(1,0xd0);
    iter = (lys_node *)llist_orig;
  }
  else if (LVar1 == LYS_LIST) {
    list_orig = (lys_node_list *)calloc(1,0xa0);
    iter = (lys_node *)list_orig;
  }
  else if (LVar1 == LYS_ANYXML) {
LAB_0017fdeb:
    any_orig = (lys_node_anydata *)calloc(1,0x78);
    iter = (lys_node *)any_orig;
  }
  else if (LVar1 == LYS_CASE) {
    cs_orig = (lys_node_case *)calloc(1,0x70);
    iter = (lys_node *)cs_orig;
  }
  else if (LVar1 == LYS_NOTIF) {
    iter = (lys_node *)calloc(1,0x78);
  }
  else if (LVar1 == LYS_RPC) {
LAB_0017fe5d:
    iter = (lys_node *)calloc(1,0x70);
  }
  else if ((LVar1 == LYS_INPUT) || (LVar1 == LYS_OUTPUT)) {
    iter = (lys_node *)calloc(1,0x78);
  }
  else {
    if (LVar1 != LYS_USES) {
      if (LVar1 != LYS_ACTION) {
        if (LVar1 != LYS_ANYDATA) {
          pLVar3 = ly_errno_location();
          *pLVar3 = LY_EINT;
          ly_log(LY_LLERR,"Internal error (%s:%d).",
                 "/workspace/llm4binary/github/license_all_cmakelists_25/RIFTIO[P]libyang/src/tree_schema.c"
                 ,0xaf1);
          goto LAB_001812d5;
        }
        goto LAB_0017fdeb;
      }
      goto LAB_0017fe5d;
    }
    uses_orig = (lys_node_uses *)calloc(1,0x88);
    iter = (lys_node *)uses_orig;
  }
  if (iter == (lys_node *)0x0) {
    pLVar3 = ly_errno_location();
    *pLVar3 = LY_EMEM;
    ly_log(LY_LLERR,"Memory allocation failed (%s()).","lys_node_dup_recursion");
    return (lys_node *)0x0;
  }
  pcVar4 = lydict_insert(_j,(char *)unres_local->item,0);
  iter->name = pcVar4;
  pcVar4 = lydict_insert(_j,(char *)unres_local->type,0);
  iter->dsc = pcVar4;
  pcVar4 = lydict_insert(_j,(char *)unres_local->str_snode,0);
  iter->ref = pcVar4;
  iter->flags = *(uint16_t *)&unres_local->module;
  iter->module = (lys_module *)parent_local;
  iter->nodetype = *(LYS_NODE *)&unres_local[1].str_snode;
  iter->prev = iter;
  iter->ext_size = *(uint8_t *)((long)&unres_local->module + 2);
  iVar2 = lys_ext_dup((lys_module *)parent_local,*(lys_ext_instance ***)&unres_local->count,
                      *(uint8_t *)((long)&unres_local->module + 2),iter,LYEXT_PAR_NODE,&iter->ext,
                      _finalize_local);
  if (iVar2 != 0) goto LAB_001812d5;
  if (*(char *)((long)&unres_local->module + 3) != '\0') {
    iter->iffeature_size = *(uint8_t *)((long)&unres_local->module + 3);
    plVar5 = (lys_iffeature *)calloc((ulong)iter->iffeature_size,0x20);
    iter->iffeature = plVar5;
    if (iter->iffeature == (lys_iffeature *)0x0) {
      pLVar3 = ly_errno_location();
      *pLVar3 = LY_EMEM;
      ly_log(LY_LLERR,"Memory allocation failed (%s()).","lys_node_dup_recursion");
      goto LAB_001812d5;
    }
  }
  if (retval._4_4_ == 0) {
    for (rc = 0; rc < (int)(uint)*(byte *)((long)&unres_local->module + 3); rc = rc + 1) {
      resolve_iffeature_getsizes
                ((lys_iffeature *)(unres_local[1].item + (long)rc * 4),
                 (uint *)((long)&unique_info + 4),(uint *)&unique_info);
      if (unique_info._4_4_ != 0) {
        size2 = (uint)((unique_info._4_4_ >> 2) + (unique_info._4_4_ & 3) != 0);
        puVar6 = (uint8_t *)malloc((ulong)size2);
        iter->iffeature[rc].expr = puVar6;
        memcpy(iter->iffeature[rc].expr,unres_local[1].item[(long)rc * 4],(ulong)size2);
        pplVar7 = (lys_feature **)calloc((ulong)(uint)unique_info,8);
        iter->iffeature[rc].features = pplVar7;
        for (size = 0; size < (uint)unique_info; size = size + 1) {
          size1 = unres_schema_dup((lys_module *)parent_local,_finalize_local,
                                   (void *)((long)unres_local[1].item[(long)rc * 4 + 2] +
                                           (long)(int)size * 8),UNRES_IFFEAT,
                                   iter->iffeature[rc].features + (int)size);
          if (size1 == 1) {
            iter->iffeature[rc].features[(int)size] =
                 *(lys_feature **)
                  ((long)unres_local[1].item[(long)rc * 4 + 2] + (long)(int)size * 8);
          }
          else if (size1 == 0xffffffff) goto LAB_001812d5;
        }
      }
      iter->iffeature[rc].ext_size = *(uint8_t *)(unres_local[1].item + (long)rc * 4 + 1);
      iVar2 = lys_ext_dup((lys_module *)parent_local,
                          (lys_ext_instance **)unres_local[1].item[(long)rc * 4 + 3],
                          *(uint8_t *)(unres_local[1].item + (long)rc * 4 + 1),iter->iffeature + rc,
                          LYEXT_PAR_IFFEATURE,&iter->iffeature[rc].ext,_finalize_local);
      if (iVar2 != 0) goto LAB_001812d5;
    }
    tmp_mod = (lys_module *)node_local;
    do {
      p = (lys_node *)tmp_mod;
      while( true ) {
        bVar16 = false;
        if (p != (lys_node *)0x0) {
          bVar16 = p->nodetype == LYS_USES;
        }
        if (!bVar16) break;
        p = p->parent;
      }
      bVar16 = false;
      if ((p != (lys_node *)0x0) && (bVar16 = false, p->nodetype == LYS_AUGMENT)) {
        tmp_mod = (lys_module *)lys_parent(p);
        bVar16 = tmp_mod != (lys_module *)0x0;
      }
    } while (bVar16);
    if (p == (lys_node *)0x0) {
      cont._6_2_ = 1;
    }
    else {
      cont._6_2_ = p->flags & 3;
    }
    if ((int)retval == 1) {
      if ((iter->flags & 4) == 0) {
        if (iter->nodetype != LYS_USES) {
          iter->flags = iter->flags & 0xfffc | cont._6_2_;
        }
      }
      else if (((cont._6_2_ & 2) != 0) && ((iter->flags & 1) != 0)) {
        ly_vlog(LYE_INARG,LY_VLOG_LYS,iter,"true","config");
        ly_vlog(LYE_SPEC,LY_VLOG_PREV,(void *)0x0,
                "State nodes cannot have configuration nodes as children.");
        goto LAB_001812d5;
      }
    }
    else if ((int)retval == 2) {
      iter->flags = iter->flags & 0xfffc;
      iter->flags = iter->flags & 0xfffb;
    }
    iVar2 = lys_node_addchild(node_local,iter->module,iter);
    if (iVar2 != 0) goto LAB_001812d5;
    if (((ulong)unres_local[1].str_snode & 0xc) == 0) {
      for (p = *(lys_node **)&unres_local[1].count; p != (lys_node *)0x0; p = p->next) {
        if (((p->nodetype & LYS_GROUPING) == LYS_UNKNOWN) &&
           (plVar8 = lys_node_dup_recursion
                               ((lys_module *)parent_local,iter,p,_finalize_local,0,(int)retval),
           plVar8 == (lys_node *)0x0)) goto LAB_001812d5;
      }
    }
    if (((((int)retval == 1) && (iter->nodetype == LYS_LIST)) && ((iter->flags & 1) != 0)) &&
       (*(char *)((long)&unres_local->module + 6) == '\0')) {
      ly_vlog(LYE_MISSCHILDSTMT,LY_VLOG_LYS,iter,"key","list");
      goto LAB_001812d5;
    }
  }
  else {
    memcpy(iter->iffeature,unres_local[1].item,(ulong)iter->iffeature_size << 5);
  }
  mod = parent_local;
  plVar8 = iter;
  iVar2 = *(int *)&unres_local[1].str_snode;
  if (iVar2 == 1) {
    if (choice->when != (lys_when *)0x0) {
      plVar15 = lys_when_dup((lys_module *)parent_local,choice->when,_finalize_local);
      cont_orig->when = plVar15;
    }
    pcVar4 = lydict_insert(_j,choice[1].dsc,0);
    cont_orig->presence = pcVar4;
    cont_orig->must_size = choice->padding[2];
    plVar14 = lys_restr_dup((lys_module *)parent_local,(lys_restr *)choice->dflt,
                            (uint)cont_orig->must_size,_finalize_local);
    cont_orig->must = plVar14;
  }
  else {
    if (iVar2 != 2) {
      if (iVar2 == 4) {
        plVar10 = &leaf_orig->type;
        old = &llist->type;
        iVar2 = ingrouping(iter);
        iVar2 = lys_type_dup((lys_module *)mod,plVar8,plVar10,old,iVar2,_finalize_local);
        if (iVar2 == 0) {
          pcVar4 = lydict_insert((ly_ctx *)parent_local->name,llist->units,0);
          leaf_orig->units = pcVar4;
          if (llist->dflt != (char **)0x0) {
            pcVar4 = lydict_insert(_j,(char *)llist->dflt,0);
            leaf_orig->dflt = pcVar4;
            iVar2 = ingrouping(iter);
            if ((iVar2 == 0) || ((leaf_orig->type).base != LY_TYPE_LEAFREF)) {
              if ((leaf_orig->type).base == LY_TYPE_IDENT) {
                ctx = (ly_ctx *)llist->module;
              }
              else {
                ctx = (ly_ctx *)parent_local;
              }
              iVar2 = unres_schema_add_node
                                ((lys_module *)ctx,_finalize_local,&leaf_orig->type,UNRES_TYPE_DFLT,
                                 (lys_node *)&leaf_orig->dflt);
              if (iVar2 == -1) goto LAB_001812d5;
            }
          }
          leaf_orig->must_size = llist->must_size;
          plVar14 = lys_restr_dup((lys_module *)parent_local,llist->must,(uint)leaf_orig->must_size,
                                  _finalize_local);
          leaf_orig->must = plVar14;
          if (llist->when == (lys_when *)0x0) {
            return iter;
          }
          plVar15 = lys_when_dup((lys_module *)parent_local,llist->when,_finalize_local);
          leaf_orig->when = plVar15;
          return iter;
        }
      }
      else if (iVar2 == 8) {
        plVar10 = &llist_orig->type;
        old_00 = &list->tpdf;
        iVar2 = ingrouping(iter);
        iVar2 = lys_type_dup((lys_module *)mod,plVar8,plVar10,(lys_type *)old_00,iVar2,
                             _finalize_local);
        if (iVar2 == 0) {
          pcVar4 = lydict_insert((ly_ctx *)parent_local->name,*(char **)&list[1].flags,0);
          llist_orig->units = pcVar4;
          llist_orig->min = *(uint32_t *)&list[1].iffeature;
          llist_orig->max = *(uint32_t *)((long)&list[1].iffeature + 4);
          llist_orig->must_size = list->unique_size;
          plVar14 = lys_restr_dup((lys_module *)parent_local,list->must,(uint)llist_orig->must_size,
                                  _finalize_local);
          llist_orig->must = plVar14;
          llist_orig->dflt_size = list->keys_size;
          ppcVar13 = (char **)malloc((ulong)llist_orig->dflt_size << 3);
          llist_orig->dflt = ppcVar13;
          rc = 0;
          do {
            if ((int)(uint)llist_orig->dflt_size <= rc) {
              if (list->when == (lys_when *)0x0) {
                return iter;
              }
              plVar15 = lys_when_dup((lys_module *)parent_local,list->when,_finalize_local);
              llist_orig->when = plVar15;
              return iter;
            }
            pcVar4 = lydict_insert(_j,(char *)list[1].ext[rc],0);
            llist_orig->dflt[rc] = pcVar4;
            iVar2 = ingrouping(iter);
            if ((iVar2 == 0) || ((llist_orig->type).base != LY_TYPE_LEAFREF)) {
              if (((llist_orig->type).base == LY_TYPE_IDENT) &&
                 ((pcVar4 = strchr(llist_orig->dflt[rc],0x3a), pcVar4 == (char *)0x0 &&
                  ((lys_module *)parent_local != list->module)))) {
                ctx = (ly_ctx *)list->module;
              }
              else {
                ctx = (ly_ctx *)parent_local;
              }
              iVar2 = unres_schema_add_node
                                ((lys_module *)ctx,_finalize_local,&llist_orig->type,UNRES_TYPE_DFLT
                                 ,(lys_node *)(llist_orig->dflt + rc));
              if (iVar2 == -1) break;
            }
            rc = rc + 1;
          } while( true );
        }
      }
      else {
        if (iVar2 != 0x10) {
          if (iVar2 != 0x20) {
            if (iVar2 == 0x40) {
              if (node[1].name == (char *)0x0) {
                return iter;
              }
              plVar15 = lys_when_dup((lys_module *)parent_local,(lys_when *)node[1].name,
                                     _finalize_local);
              cs_orig->when = plVar15;
              return iter;
            }
            if (iVar2 == 0x80) {
              return iter;
            }
            if (iVar2 == 0x100) {
              return iter;
            }
            if (iVar2 == 0x200) {
              return iter;
            }
            if (iVar2 == 0x400) {
              return iter;
            }
            if (iVar2 == 0x1000) {
              uses_orig->grp = *(lys_node_grp **)&node[1].flags;
              if (node[1].name == (char *)0x0) {
                return iter;
              }
              plVar15 = lys_when_dup((lys_module *)parent_local,(lys_when *)node[1].name,
                                     _finalize_local);
              uses_orig->when = plVar15;
              return iter;
            }
            if (iVar2 == 0x4000) {
              return iter;
            }
            if (iVar2 != 0x8020) {
              pLVar3 = ly_errno_location();
              *pLVar3 = LY_EINT;
              ly_log(LY_LLERR,"Internal error (%s:%d).",
                     "/workspace/llm4binary/github/license_all_cmakelists_25/RIFTIO[P]libyang/src/tree_schema.c"
                     ,0xc4b);
              goto LAB_001812d5;
            }
          }
          any_orig->must_size = node->padding[3];
          plVar14 = lys_restr_dup((lys_module *)parent_local,(lys_restr *)node[1].dsc,
                                  (uint)any_orig->must_size,_finalize_local);
          any_orig->must = plVar14;
          if (node[1].name == (char *)0x0) {
            return iter;
          }
          plVar15 = lys_when_dup((lys_module *)parent_local,(lys_when *)node[1].name,_finalize_local
                                );
          any_orig->when = plVar15;
          return iter;
        }
        list_orig->min = *(uint32_t *)&any[1].flags;
        list_orig->max = *(uint32_t *)any[1].padding;
        list_orig->must_size = any->padding[0];
        plVar14 = lys_restr_dup((lys_module *)parent_local,any->must,(uint)list_orig->must_size,
                                _finalize_local);
        list_orig->must = plVar14;
        list_orig->keys_size = any->padding[2];
        if (list_orig->keys_size != '\0') {
          pplVar11 = (lys_node_leaf **)calloc((ulong)list_orig->keys_size,8);
          list_orig->keys = pplVar11;
          pcVar4 = lydict_insert(_j,(char *)any[1].ext,0);
          list_orig->keys_str = pcVar4;
          if (list_orig->keys == (lys_node_leaf **)0x0) {
            pLVar3 = ly_errno_location();
            *pLVar3 = LY_EMEM;
            ly_log(LY_LLERR,"Memory allocation failed (%s()).","lys_node_dup_recursion");
            goto LAB_001812d5;
          }
          if (retval._4_4_ == 0) {
            p = node_local;
            while( true ) {
              bVar16 = false;
              if (p != (lys_node *)0x0) {
                bVar16 = p->nodetype != LYS_GROUPING;
              }
              if (!bVar16) break;
              p = p->parent;
            }
            if ((p == (lys_node *)0x0) &&
               (iVar2 = unres_schema_add_node
                                  ((lys_module *)parent_local,_finalize_local,list_orig,
                                   UNRES_LIST_KEYS,(lys_node *)0x0), iVar2 == -1))
            goto LAB_001812d5;
          }
          else {
            memcpy(list_orig->keys,any[1].dsc,(ulong)list_orig->keys_size << 3);
          }
        }
        list_orig->unique_size = any->must_size;
        plVar12 = (lys_unique *)malloc((ulong)list_orig->unique_size << 4);
        list_orig->unique = plVar12;
        if (list_orig->unique == (lys_unique *)0x0) {
          pLVar3 = ly_errno_location();
          *pLVar3 = LY_EMEM;
          ly_log(LY_LLERR,"Memory allocation failed (%s()).","lys_node_dup_recursion");
        }
        else {
          rc = 0;
          while( true ) {
            if ((int)(uint)list_orig->unique_size <= rc) {
              if (any->when == (lys_when *)0x0) {
                return iter;
              }
              plVar15 = lys_when_dup((lys_module *)parent_local,any->when,_finalize_local);
              list_orig->when = plVar15;
              return iter;
            }
            list_orig->unique[rc].expr_size = any[1].ref[(long)rc * 0x10 + 8];
            ppcVar13 = (char **)malloc((ulong)list_orig->unique[rc].expr_size << 3);
            list_orig->unique[rc].expr = ppcVar13;
            if (list_orig->unique[rc].expr == (char **)0x0) break;
            for (size = 0; (int)size < (int)(uint)list_orig->unique[rc].expr_size; size = size + 1)
            {
              pcVar4 = lydict_insert(_j,*(char **)(*(long *)(any[1].ref + (long)rc * 0x10) +
                                                  (long)(int)size * 8),0);
              list_orig->unique[rc].expr[(int)size] = pcVar4;
              puStack_80 = (undefined8 *)malloc(0x18);
              *puStack_80 = list_orig;
              puStack_80[1] = list_orig->unique[rc].expr[(int)size];
              puStack_80[2] = &list_orig->unique[rc].trg_type;
              unres_schema_dup((lys_module *)parent_local,_finalize_local,&any,UNRES_LIST_UNIQ,
                               puStack_80);
            }
            rc = rc + 1;
          }
          pLVar3 = ly_errno_location();
          *pLVar3 = LY_EMEM;
          ly_log(LY_LLERR,"Memory allocation failed (%s()).","lys_node_dup_recursion");
        }
      }
LAB_001812d5:
      lys_node_free(iter,(_func_void_lys_node_ptr_void_ptr *)0x0,0);
      return (lys_node *)0x0;
    }
    if (leaf->when != (lys_when *)0x0) {
      plVar15 = lys_when_dup((lys_module *)parent_local,leaf->when,_finalize_local);
      choice_orig->when = plVar15;
    }
    if (retval._4_4_ == 0) {
      if (leaf->must == (lys_restr *)0x0) {
        unres_schema_dup((lys_module *)parent_local,_finalize_local,leaf,UNRES_CHOICE_DFLT,
                         choice_orig);
      }
      else {
        plVar8 = choice_orig->child;
        plVar9 = lys_node_module(iter);
        size1 = lys_get_sibling(plVar8,plVar9->name,0,leaf->must->expr,0,0x807d,&choice_orig->dflt);
        if (size1 != 0) {
          if (size1 == 1) {
            pLVar3 = ly_errno_location();
            *pLVar3 = LY_EINT;
            ly_log(LY_LLERR,"Internal error (%s:%d).",
                   "/workspace/llm4binary/github/license_all_cmakelists_25/RIFTIO[P]libyang/src/tree_schema.c"
                   ,0xb9b);
          }
          goto LAB_001812d5;
        }
      }
    }
    else {
      choice_orig->dflt = (lys_node *)leaf->must;
    }
  }
  return iter;
}

Assistant:

static struct lys_node *
lys_node_dup_recursion(struct lys_module *module, struct lys_node *parent, const struct lys_node *node,
                       struct unres_schema *unres, int shallow, int finalize)
{
    struct lys_node *retval = NULL, *iter, *p;
    struct lys_module *tmp_mod;
    struct ly_ctx *ctx = module->ctx;
    int i, j, rc;
    unsigned int size, size1, size2;
    struct unres_list_uniq *unique_info;
    uint16_t flags;

    struct lys_node_container *cont = NULL;
    struct lys_node_container *cont_orig = (struct lys_node_container *)node;
    struct lys_node_choice *choice = NULL;
    struct lys_node_choice *choice_orig = (struct lys_node_choice *)node;
    struct lys_node_leaf *leaf = NULL;
    struct lys_node_leaf *leaf_orig = (struct lys_node_leaf *)node;
    struct lys_node_leaflist *llist = NULL;
    struct lys_node_leaflist *llist_orig = (struct lys_node_leaflist *)node;
    struct lys_node_list *list = NULL;
    struct lys_node_list *list_orig = (struct lys_node_list *)node;
    struct lys_node_anydata *any = NULL;
    struct lys_node_anydata *any_orig = (struct lys_node_anydata *)node;
    struct lys_node_uses *uses = NULL;
    struct lys_node_uses *uses_orig = (struct lys_node_uses *)node;
    struct lys_node_rpc_action *rpc = NULL;
    struct lys_node_inout *io = NULL;
    struct lys_node_notif *ntf = NULL;
    struct lys_node_case *cs = NULL;
    struct lys_node_case *cs_orig = (struct lys_node_case *)node;

    /* we cannot just duplicate memory since the strings are stored in
     * dictionary and we need to update dictionary counters.
     */

    switch (node->nodetype) {
    case LYS_CONTAINER:
        cont = calloc(1, sizeof *cont);
        retval = (struct lys_node *)cont;
        break;

    case LYS_CHOICE:
        choice = calloc(1, sizeof *choice);
        retval = (struct lys_node *)choice;
        break;

    case LYS_LEAF:
        leaf = calloc(1, sizeof *leaf);
        retval = (struct lys_node *)leaf;
        break;

    case LYS_LEAFLIST:
        llist = calloc(1, sizeof *llist);
        retval = (struct lys_node *)llist;
        break;

    case LYS_LIST:
        list = calloc(1, sizeof *list);
        retval = (struct lys_node *)list;
        break;

    case LYS_ANYXML:
    case LYS_ANYDATA:
        any = calloc(1, sizeof *any);
        retval = (struct lys_node *)any;
        break;

    case LYS_USES:
        uses = calloc(1, sizeof *uses);
        retval = (struct lys_node *)uses;
        break;

    case LYS_CASE:
        cs = calloc(1, sizeof *cs);
        retval = (struct lys_node *)cs;
        break;

    case LYS_RPC:
    case LYS_ACTION:
        rpc = calloc(1, sizeof *rpc);
        retval = (struct lys_node *)rpc;
        break;

    case LYS_INPUT:
    case LYS_OUTPUT:
        io = calloc(1, sizeof *io);
        retval = (struct lys_node *)io;
        break;

    case LYS_NOTIF:
        ntf = calloc(1, sizeof *ntf);
        retval = (struct lys_node *)ntf;
        break;

    default:
        LOGINT;
        goto error;
    }

    if (!retval) {
        LOGMEM;
        return NULL;
    }

    /*
     * duplicate generic part of the structure
     */
    retval->name = lydict_insert(ctx, node->name, 0);
    retval->dsc = lydict_insert(ctx, node->dsc, 0);
    retval->ref = lydict_insert(ctx, node->ref, 0);
    retval->flags = node->flags;

    retval->module = module;
    retval->nodetype = node->nodetype;

    retval->prev = retval;

    retval->ext_size = node->ext_size;
    if (lys_ext_dup(module, node->ext, node->ext_size, retval, LYEXT_PAR_NODE, &retval->ext, unres)) {
        goto error;
    }

    if (node->iffeature_size) {
        retval->iffeature_size = node->iffeature_size;
        retval->iffeature = calloc(retval->iffeature_size, sizeof *retval->iffeature);
        if (!retval->iffeature) {
            LOGMEM;
            goto error;
        }
    }

    if (!shallow) {
        for (i = 0; i < node->iffeature_size; ++i) {
            resolve_iffeature_getsizes(&node->iffeature[i], &size1, &size2);
            if (size1) {
                /* there is something to duplicate */

                /* duplicate compiled expression */
                size = (size1 / 4) + (size1 % 4) ? 1 : 0;
                retval->iffeature[i].expr = malloc(size * sizeof *retval->iffeature[i].expr);
                memcpy(retval->iffeature[i].expr, node->iffeature[i].expr, size * sizeof *retval->iffeature[i].expr);

                /* list of feature pointer must be updated to point to the resulting tree */
                retval->iffeature[i].features = calloc(size2, sizeof *retval->iffeature[i].features);
                for (j = 0; (unsigned int)j < size2; j++) {
                    rc = unres_schema_dup(module, unres, &node->iffeature[i].features[j], UNRES_IFFEAT,
                                          &retval->iffeature[i].features[j]);
                    if (rc == EXIT_FAILURE) {
                        /* feature is resolved in origin, so copy it
                         * - duplication is used for instantiating groupings
                         * and if-feature inside grouping is supposed to be
                         * resolved inside the original grouping, so we want
                         * to keep pointers to features from the grouping
                         * context */
                        retval->iffeature[i].features[j] = node->iffeature[i].features[j];
                    } else if (rc == -1) {
                        goto error;
                    } /* else unres was duplicated */
                }
            }

            /* duplicate if-feature's extensions */
            retval->iffeature[i].ext_size = node->iffeature[i].ext_size;
            if (lys_ext_dup(module, node->iffeature[i].ext, node->iffeature[i].ext_size,
                            &retval->iffeature[i], LYEXT_PAR_IFFEATURE, &retval->iffeature[i].ext, unres)) {
                goto error;
            }
        }

        /* inherit config flags */
        p = parent;
        do {
            for (iter = p; iter && (iter->nodetype == LYS_USES); iter = iter->parent);
        } while (iter && iter->nodetype == LYS_AUGMENT && (p = lys_parent(iter)));
        if (iter) {
            flags = iter->flags & LYS_CONFIG_MASK;
        } else {
            /* default */
            flags = LYS_CONFIG_W;
        }

        switch (finalize) {
        case 1:
            /* inherit config flags */
            if (retval->flags & LYS_CONFIG_SET) {
                /* skip nodes with an explicit config value */
                if ((flags & LYS_CONFIG_R) && (retval->flags & LYS_CONFIG_W)) {
                    LOGVAL(LYE_INARG, LY_VLOG_LYS, retval, "true", "config");
                    LOGVAL(LYE_SPEC, LY_VLOG_PREV, NULL, "State nodes cannot have configuration nodes as children.");
                    goto error;
                }
                break;
            }

            if (retval->nodetype != LYS_USES) {
                retval->flags = (retval->flags & ~LYS_CONFIG_MASK) | flags;
            }
            break;
        case 2:
            /* erase config flags */
            retval->flags &= ~LYS_CONFIG_MASK;
            retval->flags &= ~LYS_CONFIG_SET;
            break;
        }

        /* connect it to the parent */
        if (lys_node_addchild(parent, retval->module, retval)) {
            goto error;
        }

        /* go recursively */
        if (!(node->nodetype & (LYS_LEAF | LYS_LEAFLIST))) {
            LY_TREE_FOR(node->child, iter) {
                if (iter->nodetype & LYS_GROUPING) {
                    /* do not instantiate groupings */
                    continue;
                }
                if (!lys_node_dup_recursion(module, retval, iter, unres, 0, finalize)) {
                    goto error;
                }
            }
        }

        if (finalize == 1) {
            /* check that configuration lists have keys
             * - we really want to check keys_size in original node, because the keys are
             * not yet resolved here, it is done below in nodetype specific part */
            if ((retval->nodetype == LYS_LIST) && (retval->flags & LYS_CONFIG_W)
                    && !((struct lys_node_list *)node)->keys_size) {
                LOGVAL(LYE_MISSCHILDSTMT, LY_VLOG_LYS, retval, "key", "list");
                goto error;
            }
        }
    } else {
        memcpy(retval->iffeature, node->iffeature, retval->iffeature_size * sizeof *retval->iffeature);
    }

    /*
     * duplicate specific part of the structure
     */
    switch (node->nodetype) {
    case LYS_CONTAINER:
        if (cont_orig->when) {
            cont->when = lys_when_dup(module, cont_orig->when, unres);
        }
        cont->presence = lydict_insert(ctx, cont_orig->presence, 0);

        cont->must_size = cont_orig->must_size;
        cont->must = lys_restr_dup(module, cont_orig->must, cont->must_size, unres);

        /* typedefs are not needed in instantiated grouping, nor the deviation's shallow copy */

        break;
    case LYS_CHOICE:
        if (choice_orig->when) {
            choice->when = lys_when_dup(module, choice_orig->when, unres);
        }

        if (!shallow) {
            if (choice_orig->dflt) {
                rc = lys_get_sibling(choice->child, lys_node_module(retval)->name, 0, choice_orig->dflt->name, 0,
                                            LYS_ANYDATA | LYS_CASE | LYS_CONTAINER | LYS_LEAF | LYS_LEAFLIST | LYS_LIST,
                                            (const struct lys_node **)&choice->dflt);
                if (rc) {
                    if (rc == EXIT_FAILURE) {
                        LOGINT;
                    }
                    goto error;
                }
            } else {
                /* useless to check return value, we don't know whether
                * there really wasn't any default defined or it just hasn't
                * been resolved, we just hope for the best :)
                */
                unres_schema_dup(module, unres, choice_orig, UNRES_CHOICE_DFLT, choice);
            }
        } else {
            choice->dflt = choice_orig->dflt;
        }
        break;

    case LYS_LEAF:
        if (lys_type_dup(module, retval, &(leaf->type), &(leaf_orig->type), ingrouping(retval), unres)) {
            goto error;
        }
        leaf->units = lydict_insert(module->ctx, leaf_orig->units, 0);

        if (leaf_orig->dflt) {
            leaf->dflt = lydict_insert(ctx, leaf_orig->dflt, 0);
            if (!ingrouping(retval) || (leaf->type.base != LY_TYPE_LEAFREF)) {
                /* problem is when it is an identityref referencing an identity from a module
                 * and we are using the grouping in a different module */
                if (leaf->type.base == LY_TYPE_IDENT) {
                    tmp_mod = leaf_orig->module;
                } else {
                    tmp_mod = module;
                }
                if (unres_schema_add_node(tmp_mod, unres, &leaf->type, UNRES_TYPE_DFLT,
                                          (struct lys_node *)(&leaf->dflt)) == -1) {
                    goto error;
                }
            }
        }

        leaf->must_size = leaf_orig->must_size;
        leaf->must = lys_restr_dup(module, leaf_orig->must, leaf->must_size, unres);

        if (leaf_orig->when) {
            leaf->when = lys_when_dup(module, leaf_orig->when, unres);
        }
        break;

    case LYS_LEAFLIST:
        if (lys_type_dup(module, retval, &(llist->type), &(llist_orig->type), ingrouping(retval), unres)) {
            goto error;
        }
        llist->units = lydict_insert(module->ctx, llist_orig->units, 0);

        llist->min = llist_orig->min;
        llist->max = llist_orig->max;

        llist->must_size = llist_orig->must_size;
        llist->must = lys_restr_dup(module, llist_orig->must, llist->must_size, unres);

        llist->dflt_size = llist_orig->dflt_size;
        llist->dflt = malloc(llist->dflt_size * sizeof *llist->dflt);
        for (i = 0; i < llist->dflt_size; i++) {
            llist->dflt[i] = lydict_insert(ctx, llist_orig->dflt[i], 0);
            if (!ingrouping(retval) || (llist->type.base != LY_TYPE_LEAFREF)) {
                if ((llist->type.base == LY_TYPE_IDENT) && !strchr(llist->dflt[i], ':') && (module != llist_orig->module)) {
                    tmp_mod = llist_orig->module;
                } else {
                    tmp_mod = module;
                }
                if (unres_schema_add_node(tmp_mod, unres, &llist->type, UNRES_TYPE_DFLT,
                                          (struct lys_node *)(&llist->dflt[i])) == -1) {
                    goto error;
                }
            }
        }

        if (llist_orig->when) {
            llist->when = lys_when_dup(module, llist_orig->when, unres);
        }
        break;

    case LYS_LIST:
        list->min = list_orig->min;
        list->max = list_orig->max;

        list->must_size = list_orig->must_size;
        list->must = lys_restr_dup(module, list_orig->must, list->must_size, unres);

        /* typedefs are not needed in instantiated grouping, nor the deviation's shallow copy */

        list->keys_size = list_orig->keys_size;
        if (list->keys_size) {
            list->keys = calloc(list->keys_size, sizeof *list->keys);
            list->keys_str = lydict_insert(ctx, list_orig->keys_str, 0);
            if (!list->keys) {
                LOGMEM;
                goto error;
            }

            if (!shallow) {
                /* the keys are going to be resolved only if the list is instantiated in data tree, not just
                 * in another grouping */
                for (iter = parent; iter && iter->nodetype != LYS_GROUPING; iter = iter->parent);
                if (!iter && unres_schema_add_node(module, unres, list, UNRES_LIST_KEYS, NULL) == -1) {
                    goto error;
                }
            } else {
                memcpy(list->keys, list_orig->keys, list->keys_size * sizeof *list->keys);
            }
        }

        list->unique_size = list_orig->unique_size;
        list->unique = malloc(list->unique_size * sizeof *list->unique);
        if (!list->unique) {
            LOGMEM;
            goto error;
        }
        for (i = 0; i < list->unique_size; ++i) {
            list->unique[i].expr_size = list_orig->unique[i].expr_size;
            list->unique[i].expr = malloc(list->unique[i].expr_size * sizeof *list->unique[i].expr);
            if (!list->unique[i].expr) {
                LOGMEM;
                goto error;
            }
            for (j = 0; j < list->unique[i].expr_size; j++) {
                list->unique[i].expr[j] = lydict_insert(ctx, list_orig->unique[i].expr[j], 0);

                /* if it stays in unres list, duplicate it also there */
                unique_info = malloc(sizeof *unique_info);
                unique_info->list = (struct lys_node *)list;
                unique_info->expr = list->unique[i].expr[j];
                unique_info->trg_type = &list->unique[i].trg_type;
                unres_schema_dup(module, unres, &list_orig, UNRES_LIST_UNIQ, unique_info);
            }
        }

        if (list_orig->when) {
            list->when = lys_when_dup(module, list_orig->when, unres);
        }
        break;

    case LYS_ANYXML:
    case LYS_ANYDATA:
        any->must_size = any_orig->must_size;
        any->must = lys_restr_dup(module, any_orig->must, any->must_size, unres);

        if (any_orig->when) {
            any->when = lys_when_dup(module, any_orig->when, unres);
        }
        break;

    case LYS_USES:
        uses->grp = uses_orig->grp;

        if (uses_orig->when) {
            uses->when = lys_when_dup(module, uses_orig->when, unres);
        }
        /* it is not needed to duplicate refine, nor augment. They are already applied to the uses children */
        break;

    case LYS_CASE:
        if (cs_orig->when) {
            cs->when = lys_when_dup(module, cs_orig->when, unres);
        }
        break;

    case LYS_ACTION:
    case LYS_RPC:
    case LYS_INPUT:
    case LYS_OUTPUT:
    case LYS_NOTIF:
        /* typedefs are not needed in instantiated grouping, nor the deviation's shallow copy */
        break;

    default:
        /* LY_NODE_AUGMENT */
        LOGINT;
        goto error;
    }

    return retval;

error:

    lys_node_free(retval, NULL, 0);
    return NULL;
}